

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::MarkOrCopyLine_CR_OR_LF(FlowBuffer *this)

{
  const_byteptr in_RDI;
  const_byteptr data;
  uint in_stack_ffffffffffffffe4;
  FlowBuffer *this_00;
  
  if ((*(long *)(in_RDI + 0x28) != 0) && (*(long *)(in_RDI + 0x30) != 0)) {
    if ((*(int *)(in_RDI + 0x48) == 1) &&
       ((*(ulong *)(in_RDI + 0x28) < *(ulong *)(in_RDI + 0x30) &&
        (**(char **)(in_RDI + 0x28) == '\n')))) {
      in_RDI[0x48] = '\0';
      in_RDI[0x49] = '\0';
      in_RDI[0x4a] = '\0';
      in_RDI[0x4b] = '\0';
      *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    }
    for (this_00 = *(FlowBuffer **)(in_RDI + 0x28); this_00 < *(FlowBuffer **)(in_RDI + 0x30);
        this_00 = (FlowBuffer *)((long)&this_00->_vptr_FlowBuffer + 1)) {
      in_stack_ffffffffffffffe4 = (uint)*(byte *)&this_00->_vptr_FlowBuffer;
      if (in_stack_ffffffffffffffe4 == 10) {
LAB_0010412b:
        if (*(int *)(in_RDI + 8) == 0) {
          *(int *)(in_RDI + 0x1c) = (int)this_00 - (int)*(undefined8 *)(in_RDI + 0x28);
        }
        else {
          AppendToBuffer(this_00,in_RDI,in_stack_ffffffffffffffe4);
          *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + -1;
        }
        in_RDI[0x18] = '\x01';
        return;
      }
      if (in_stack_ffffffffffffffe4 == 0xd) {
        in_RDI[0x48] = '\x01';
        in_RDI[0x49] = '\0';
        in_RDI[0x4a] = '\0';
        in_RDI[0x4b] = '\0';
        goto LAB_0010412b;
      }
    }
    AppendToBuffer(this_00,in_RDI,in_stack_ffffffffffffffe4);
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine_CR_OR_LF()
	{
	if ( ! (orig_data_begin_ && orig_data_end_) )
		return;

	if ( state_ == CR_OR_LF_1 && orig_data_begin_ < orig_data_end_ && *orig_data_begin_ == LF )
		{
		state_ = CR_OR_LF_0;
		++orig_data_begin_;
		}

	const_byteptr data;
	for ( data = orig_data_begin_; data < orig_data_end_; ++data )
		{
		switch ( *data )
			{
			case CR:
				state_ = CR_OR_LF_1;
				goto found_end_of_line;

			case LF:
				// state_ = CR_OR_LF_0;
				goto found_end_of_line;

			default:
				// state_ = CR_OR_LF_0;
				break;
			}
		}

	AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
	return;

found_end_of_line:
	if ( buffer_n_ == 0 )
		{
		frame_length_ = data - orig_data_begin_;
		}
	else
		{
		AppendToBuffer(orig_data_begin_, data + 1 - orig_data_begin_);
		// But eliminate the last CR or LF
		--buffer_n_;
		}
	message_complete_ = true;

#if DEBUG_FLOW_BUFFER
	fprintf(stderr, "%.6f Line complete: [%s]\n", network_time(),
	        string((const char*)begin(), (const char*)end()).c_str());
#endif
	}